

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# imgui_demo.cpp
# Opt level: O0

void ImGui::ShowStyleEditor(ImGuiStyle *ref)

{
  ImVec4 IVar1;
  undefined1 auVar2 [16];
  undefined1 auVar3 [16];
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  float fVar6;
  ImVec2 IVar7;
  undefined1 auVar8 [11];
  undefined1 auVar9 [11];
  undefined1 auVar10 [12];
  undefined1 auVar11 [12];
  undefined1 auVar12 [13];
  undefined1 auVar13 [13];
  undefined1 auVar14 [14];
  undefined1 auVar15 [14];
  bool bVar16;
  int iVar17;
  ImU32 col_00;
  char *__s;
  size_t sVar18;
  ImVec4 *pIVar19;
  ImDrawList *this;
  ImVec4 *pIVar20;
  undefined1 extraout_XMM0_Ba;
  undefined1 extraout_XMM0_Ba_00;
  undefined1 extraout_XMM0_Ba_01;
  undefined1 extraout_XMM0_Ba_02;
  undefined1 extraout_XMM0_Ba_03;
  undefined1 extraout_XMM0_Ba_04;
  undefined1 extraout_XMM0_Ba_05;
  undefined1 extraout_XMM0_Ba_06;
  undefined1 extraout_XMM0_Ba_07;
  undefined1 extraout_XMM0_Ba_08;
  undefined1 extraout_XMM0_Ba_09;
  undefined1 extraout_XMM0_Ba_10;
  undefined1 extraout_XMM0_Ba_11;
  undefined1 extraout_XMM0_Ba_12;
  undefined1 extraout_XMM0_Ba_13;
  undefined1 extraout_XMM0_Ba_14;
  undefined1 extraout_XMM0_Ba_15;
  undefined1 extraout_XMM0_Ba_16;
  undefined1 extraout_XMM0_Ba_17;
  undefined1 extraout_XMM0_Ba_18;
  undefined1 extraout_XMM0_Ba_19;
  undefined1 extraout_XMM0_Ba_20;
  undefined1 extraout_XMM0_Ba_21;
  undefined1 extraout_XMM0_Ba_22;
  undefined1 extraout_XMM0_Ba_23;
  undefined1 extraout_XMM0_Ba_24;
  undefined1 extraout_XMM0_Ba_25;
  undefined1 extraout_XMM0_Ba_26;
  undefined1 extraout_XMM0_Ba_27;
  undefined1 extraout_XMM0_Ba_28;
  undefined1 extraout_XMM0_Ba_29;
  undefined1 extraout_XMM0_Ba_30;
  undefined1 extraout_XMM0_Ba_31;
  undefined1 extraout_XMM0_Ba_32;
  char extraout_XMM0_Ba_33;
  char extraout_XMM0_Ba_34;
  undefined1 extraout_XMM0_Ba_35;
  undefined1 extraout_XMM0_Ba_36;
  undefined1 extraout_XMM0_Ba_37;
  undefined1 extraout_XMM0_Ba_38;
  char cVar21;
  undefined1 extraout_XMM0_Ba_39;
  char extraout_XMM0_Ba_40;
  undefined1 extraout_XMM0_Ba_41;
  undefined1 extraout_XMM0_Ba_42;
  undefined1 extraout_XMM0_Ba_43;
  undefined1 extraout_XMM0_Ba_44;
  undefined1 extraout_XMM0_Ba_45;
  undefined1 uVar22;
  undefined1 extraout_XMM0_Ba_46;
  undefined1 extraout_XMM0_Bb;
  undefined1 extraout_XMM0_Bb_00;
  undefined1 extraout_XMM0_Bb_01;
  undefined1 extraout_XMM0_Bb_02;
  undefined1 extraout_XMM0_Bb_03;
  undefined1 extraout_XMM0_Bb_04;
  undefined1 extraout_XMM0_Bb_05;
  undefined1 extraout_XMM0_Bb_06;
  undefined1 extraout_XMM0_Bb_07;
  undefined1 extraout_XMM0_Bb_08;
  undefined1 extraout_XMM0_Bb_09;
  undefined1 extraout_XMM0_Bb_10;
  undefined1 extraout_XMM0_Bb_11;
  undefined1 extraout_XMM0_Bb_12;
  undefined1 extraout_XMM0_Bb_13;
  undefined1 extraout_XMM0_Bb_14;
  undefined1 extraout_XMM0_Bb_15;
  undefined1 extraout_XMM0_Bb_16;
  undefined1 extraout_XMM0_Bb_17;
  undefined1 extraout_XMM0_Bb_18;
  undefined1 extraout_XMM0_Bb_19;
  undefined1 extraout_XMM0_Bb_20;
  undefined1 extraout_XMM0_Bb_21;
  undefined1 extraout_XMM0_Bb_22;
  undefined1 extraout_XMM0_Bb_23;
  undefined1 extraout_XMM0_Bb_24;
  undefined1 extraout_XMM0_Bb_25;
  undefined1 extraout_XMM0_Bb_26;
  undefined1 extraout_XMM0_Bb_27;
  undefined1 extraout_XMM0_Bb_28;
  undefined1 extraout_XMM0_Bb_29;
  undefined1 extraout_XMM0_Bb_30;
  undefined1 extraout_XMM0_Bb_31;
  undefined1 extraout_XMM0_Bb_32;
  char extraout_XMM0_Bb_33;
  char extraout_XMM0_Bb_34;
  undefined1 extraout_XMM0_Bb_35;
  undefined1 extraout_XMM0_Bb_36;
  undefined1 extraout_XMM0_Bb_37;
  undefined1 extraout_XMM0_Bb_38;
  char cVar23;
  undefined1 extraout_XMM0_Bb_39;
  char extraout_XMM0_Bb_40;
  undefined1 extraout_XMM0_Bb_41;
  undefined1 extraout_XMM0_Bb_42;
  undefined1 extraout_XMM0_Bb_43;
  undefined1 extraout_XMM0_Bb_44;
  undefined1 extraout_XMM0_Bb_45;
  undefined1 uVar24;
  undefined1 extraout_XMM0_Bb_46;
  undefined1 extraout_XMM0_Bc;
  undefined1 extraout_XMM0_Bc_00;
  undefined1 uVar25;
  undefined1 extraout_XMM0_Bc_01;
  undefined1 extraout_XMM0_Bc_02;
  undefined1 extraout_XMM0_Bc_03;
  undefined1 extraout_XMM0_Bc_04;
  undefined1 extraout_XMM0_Bc_05;
  undefined1 extraout_XMM0_Bc_06;
  undefined1 extraout_XMM0_Bc_07;
  undefined1 extraout_XMM0_Bc_08;
  undefined1 extraout_XMM0_Bc_09;
  undefined1 extraout_XMM0_Bc_10;
  undefined1 extraout_XMM0_Bc_11;
  undefined1 extraout_XMM0_Bc_12;
  undefined1 extraout_XMM0_Bc_13;
  undefined1 extraout_XMM0_Bc_14;
  undefined1 extraout_XMM0_Bc_15;
  undefined1 extraout_XMM0_Bc_16;
  undefined1 extraout_XMM0_Bc_17;
  undefined1 extraout_XMM0_Bc_18;
  undefined1 extraout_XMM0_Bc_19;
  undefined1 extraout_XMM0_Bc_20;
  undefined1 extraout_XMM0_Bc_21;
  undefined1 extraout_XMM0_Bc_22;
  undefined1 extraout_XMM0_Bc_23;
  undefined1 extraout_XMM0_Bc_24;
  undefined1 extraout_XMM0_Bc_25;
  undefined1 extraout_XMM0_Bc_26;
  undefined1 extraout_XMM0_Bc_27;
  undefined1 extraout_XMM0_Bc_28;
  undefined1 extraout_XMM0_Bc_29;
  undefined1 extraout_XMM0_Bc_30;
  undefined1 extraout_XMM0_Bc_31;
  undefined1 extraout_XMM0_Bc_32;
  char extraout_XMM0_Bc_33;
  char extraout_XMM0_Bc_34;
  undefined1 extraout_XMM0_Bc_35;
  undefined1 extraout_XMM0_Bc_36;
  undefined1 extraout_XMM0_Bc_37;
  undefined1 extraout_XMM0_Bc_38;
  char cVar26;
  undefined1 extraout_XMM0_Bc_39;
  char extraout_XMM0_Bc_40;
  undefined1 extraout_XMM0_Bc_41;
  undefined1 extraout_XMM0_Bc_42;
  undefined1 extraout_XMM0_Bc_43;
  undefined1 extraout_XMM0_Bc_44;
  undefined1 extraout_XMM0_Bc_45;
  undefined1 extraout_XMM0_Bc_46;
  undefined1 extraout_XMM0_Bd;
  undefined1 extraout_XMM0_Bd_00;
  undefined1 uVar27;
  undefined1 extraout_XMM0_Bd_01;
  undefined1 extraout_XMM0_Bd_02;
  undefined1 extraout_XMM0_Bd_03;
  undefined1 extraout_XMM0_Bd_04;
  undefined1 extraout_XMM0_Bd_05;
  undefined1 extraout_XMM0_Bd_06;
  undefined1 extraout_XMM0_Bd_07;
  undefined1 extraout_XMM0_Bd_08;
  undefined1 extraout_XMM0_Bd_09;
  undefined1 extraout_XMM0_Bd_10;
  undefined1 extraout_XMM0_Bd_11;
  undefined1 extraout_XMM0_Bd_12;
  undefined1 extraout_XMM0_Bd_13;
  undefined1 extraout_XMM0_Bd_14;
  undefined1 extraout_XMM0_Bd_15;
  undefined1 extraout_XMM0_Bd_16;
  undefined1 extraout_XMM0_Bd_17;
  undefined1 extraout_XMM0_Bd_18;
  undefined1 extraout_XMM0_Bd_19;
  undefined1 extraout_XMM0_Bd_20;
  undefined1 extraout_XMM0_Bd_21;
  undefined1 extraout_XMM0_Bd_22;
  undefined1 extraout_XMM0_Bd_23;
  undefined1 extraout_XMM0_Bd_24;
  undefined1 extraout_XMM0_Bd_25;
  undefined1 extraout_XMM0_Bd_26;
  undefined1 extraout_XMM0_Bd_27;
  undefined1 extraout_XMM0_Bd_28;
  undefined1 extraout_XMM0_Bd_29;
  undefined1 extraout_XMM0_Bd_30;
  undefined1 extraout_XMM0_Bd_31;
  undefined1 extraout_XMM0_Bd_32;
  char extraout_XMM0_Bd_33;
  char extraout_XMM0_Bd_34;
  undefined1 extraout_XMM0_Bd_35;
  undefined1 extraout_XMM0_Bd_36;
  undefined1 extraout_XMM0_Bd_37;
  undefined1 extraout_XMM0_Bd_38;
  char cVar28;
  undefined1 extraout_XMM0_Bd_39;
  char extraout_XMM0_Bd_40;
  undefined1 extraout_XMM0_Bd_41;
  undefined1 extraout_XMM0_Bd_42;
  undefined1 extraout_XMM0_Bd_43;
  undefined1 extraout_XMM0_Bd_44;
  undefined1 extraout_XMM0_Bd_45;
  undefined1 extraout_XMM0_Bd_46;
  undefined1 extraout_XMM0_Be;
  char cVar29;
  undefined1 extraout_XMM0_Bf;
  char cVar30;
  undefined1 extraout_XMM0_Bg;
  char cVar31;
  undefined1 extraout_XMM0_Bh;
  char cVar32;
  char cVar33;
  char cVar34;
  char cVar35;
  char cVar36;
  char cVar37;
  char cVar38;
  char cVar39;
  byte bVar40;
  float local_134;
  float local_104;
  float local_fc;
  float local_f4;
  ImVec2 local_f0;
  ImVec2 local_e8;
  ImVec2 local_e0;
  ImVec2 p1;
  float offset_y;
  float offset_x;
  float canvas_width;
  float rad;
  float RAD_MAX;
  float RAD_MIN;
  int n;
  float min_widget_width;
  ImDrawList *draw_list;
  ImVec2 local_a0;
  undefined4 local_98;
  undefined4 local_94;
  float MAX_SCALE;
  float MIN_SCALE;
  ImFontAtlas *atlas;
  ImGuiIO *io;
  ImVec2 local_78;
  char *local_70;
  char *name_1;
  int i_1;
  char *local_58;
  char *name;
  ImVec4 *col;
  int i;
  int local_3c;
  int window_menu_button_position;
  ImVec2 local_30;
  bool local_27;
  bool local_26;
  bool local_25 [6];
  bool border_2;
  bool border_1;
  bool border;
  ImGuiStyle *local_18;
  ImGuiStyle *style;
  ImGuiStyle *ref_local;
  
  style = ref;
  if (GImGuiDemoMarkerCallback != (ImGuiDemoMarkerCallback)0x0) {
    (*GImGuiDemoMarkerCallback)
              ("/workspace/llm4binary/github/license_all_cmakelists_25/iboB[P]BlockOut3000/build_O0/_deps/imgui-src/imgui_demo.cpp"
               ,0x17fb,"Tools/Style Editor",GImGuiDemoMarkerCallbackUserData);
  }
  local_18 = GetStyle();
  if ((ShowStyleEditor(ImGuiStyle*)::ref_saved_style == '\0') &&
     (iVar17 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style), iVar17 != 0)) {
    ImGuiStyle::ImGuiStyle(&ShowStyleEditor::ref_saved_style);
    __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::ref_saved_style);
  }
  if (((ShowStyleEditor::init & 1U) != 0) && (style == (ImGuiStyle *)0x0)) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x418);
  }
  ShowStyleEditor::init = false;
  if (style == (ImGuiStyle *)0x0) {
    style = &ShowStyleEditor::ref_saved_style;
  }
  fVar6 = GetWindowWidth();
  PushItemWidth(fVar6 * 0.5);
  bVar16 = ShowStyleSelector("Colors##Selector");
  if (bVar16) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x418);
  }
  ShowFontSelector("Fonts##Selector");
  bVar16 = SliderFloat("FrameRounding",&local_18->FrameRounding,
                       (float)(CONCAT13(extraout_XMM0_Bd,
                                        CONCAT12(extraout_XMM0_Bc,
                                                 CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba))) ^
                              CONCAT13(extraout_XMM0_Bd,
                                       CONCAT12(extraout_XMM0_Bc,
                                                CONCAT11(extraout_XMM0_Bb,extraout_XMM0_Ba)))),12.0,
                       "%.0f",0);
  if (bVar16) {
    local_18->GrabRounding = local_18->FrameRounding;
  }
  local_25[0] = 0.0 < local_18->WindowBorderSize;
  bVar16 = Checkbox("WindowBorder",local_25);
  uVar22 = extraout_XMM0_Ba_00;
  uVar24 = extraout_XMM0_Bb_00;
  uVar25 = extraout_XMM0_Bc_00;
  uVar27 = extraout_XMM0_Bd_00;
  if (bVar16) {
    local_f4 = 1.0;
    if ((local_25[0] & 1U) == 0) {
      local_f4 = 0.0;
    }
    uVar22 = 0;
    uVar24 = 0;
    uVar25 = (undefined1)((uint)local_f4 >> 0x10);
    uVar27 = (undefined1)((uint)local_f4 >> 0x18);
    local_18->WindowBorderSize = local_f4;
  }
  SameLine((float)(CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22))) ^
                  CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22)))),-1.0);
  local_26 = 0.0 < local_18->FrameBorderSize;
  bVar16 = Checkbox("FrameBorder",&local_26);
  uVar22 = extraout_XMM0_Ba_01;
  uVar24 = extraout_XMM0_Bb_01;
  uVar25 = extraout_XMM0_Bc_01;
  uVar27 = extraout_XMM0_Bd_01;
  if (bVar16) {
    local_fc = 1.0;
    if ((local_26 & 1U) == 0) {
      local_fc = 0.0;
    }
    uVar22 = 0;
    uVar24 = 0;
    uVar25 = (undefined1)((uint)local_fc >> 0x10);
    uVar27 = (undefined1)((uint)local_fc >> 0x18);
    local_18->FrameBorderSize = local_fc;
  }
  SameLine((float)(CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22))) ^
                  CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22)))),-1.0);
  local_27 = 0.0 < local_18->PopupBorderSize;
  bVar16 = Checkbox("PopupBorder",&local_27);
  if (bVar16) {
    local_104 = 1.0;
    if ((local_27 & 1U) == 0) {
      local_104 = 0.0;
    }
    local_18->PopupBorderSize = local_104;
  }
  ImVec2::ImVec2(&local_30,0.0,0.0);
  bVar16 = Button("Save Ref",&local_30);
  uVar22 = extraout_XMM0_Ba_02;
  uVar24 = extraout_XMM0_Bb_02;
  uVar25 = extraout_XMM0_Bc_02;
  uVar27 = extraout_XMM0_Bd_02;
  if (bVar16) {
    memcpy(&ShowStyleEditor::ref_saved_style,local_18,0x418);
    memcpy(style,&ShowStyleEditor::ref_saved_style,0x418);
    uVar22 = extraout_XMM0_Ba_03;
    uVar24 = extraout_XMM0_Bb_03;
    uVar25 = extraout_XMM0_Bc_03;
    uVar27 = extraout_XMM0_Bd_03;
  }
  SameLine((float)(CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22))) ^
                  CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22)))),-1.0);
  ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffc8,0.0,0.0);
  bVar16 = Button("Revert Ref",(ImVec2 *)&stack0xffffffffffffffc8);
  uVar22 = extraout_XMM0_Ba_04;
  uVar24 = extraout_XMM0_Bb_04;
  uVar25 = extraout_XMM0_Bc_04;
  uVar27 = extraout_XMM0_Bd_04;
  if (bVar16) {
    memcpy(local_18,style,0x418);
    uVar22 = extraout_XMM0_Ba_05;
    uVar24 = extraout_XMM0_Bb_05;
    uVar25 = extraout_XMM0_Bc_05;
    uVar27 = extraout_XMM0_Bd_05;
  }
  SameLine((float)(CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22))) ^
                  CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22)))),-1.0);
  HelpMarker(
            "Save/Revert in local non-persistent storage. Default Colors definition are not affected. Use \"Export\" below to save them somewhere."
            );
  Separator();
  bVar16 = BeginTabBar("##tabs",0);
  if (bVar16) {
    bVar16 = BeginTabItem("Sizes",(bool *)0x0,0);
    if (bVar16) {
      Text("Main");
      SliderFloat2("WindowPadding",&(local_18->WindowPadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_06,
                                    CONCAT12(extraout_XMM0_Bc_06,
                                             CONCAT11(extraout_XMM0_Bb_06,extraout_XMM0_Ba_06))) ^
                          CONCAT13(extraout_XMM0_Bd_06,
                                   CONCAT12(extraout_XMM0_Bc_06,
                                            CONCAT11(extraout_XMM0_Bb_06,extraout_XMM0_Ba_06)))),
                   20.0,"%.0f",0);
      SliderFloat2("FramePadding",&(local_18->FramePadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_07,
                                    CONCAT12(extraout_XMM0_Bc_07,
                                             CONCAT11(extraout_XMM0_Bb_07,extraout_XMM0_Ba_07))) ^
                          CONCAT13(extraout_XMM0_Bd_07,
                                   CONCAT12(extraout_XMM0_Bc_07,
                                            CONCAT11(extraout_XMM0_Bb_07,extraout_XMM0_Ba_07)))),
                   20.0,"%.0f",0);
      SliderFloat2("CellPadding",&(local_18->CellPadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_08,
                                    CONCAT12(extraout_XMM0_Bc_08,
                                             CONCAT11(extraout_XMM0_Bb_08,extraout_XMM0_Ba_08))) ^
                          CONCAT13(extraout_XMM0_Bd_08,
                                   CONCAT12(extraout_XMM0_Bc_08,
                                            CONCAT11(extraout_XMM0_Bb_08,extraout_XMM0_Ba_08)))),
                   20.0,"%.0f",0);
      SliderFloat2("ItemSpacing",&(local_18->ItemSpacing).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_09,
                                    CONCAT12(extraout_XMM0_Bc_09,
                                             CONCAT11(extraout_XMM0_Bb_09,extraout_XMM0_Ba_09))) ^
                          CONCAT13(extraout_XMM0_Bd_09,
                                   CONCAT12(extraout_XMM0_Bc_09,
                                            CONCAT11(extraout_XMM0_Bb_09,extraout_XMM0_Ba_09)))),
                   20.0,"%.0f",0);
      SliderFloat2("ItemInnerSpacing",&(local_18->ItemInnerSpacing).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_10,
                                    CONCAT12(extraout_XMM0_Bc_10,
                                             CONCAT11(extraout_XMM0_Bb_10,extraout_XMM0_Ba_10))) ^
                          CONCAT13(extraout_XMM0_Bd_10,
                                   CONCAT12(extraout_XMM0_Bc_10,
                                            CONCAT11(extraout_XMM0_Bb_10,extraout_XMM0_Ba_10)))),
                   20.0,"%.0f",0);
      SliderFloat2("TouchExtraPadding",&(local_18->TouchExtraPadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_11,
                                    CONCAT12(extraout_XMM0_Bc_11,
                                             CONCAT11(extraout_XMM0_Bb_11,extraout_XMM0_Ba_11))) ^
                          CONCAT13(extraout_XMM0_Bd_11,
                                   CONCAT12(extraout_XMM0_Bc_11,
                                            CONCAT11(extraout_XMM0_Bb_11,extraout_XMM0_Ba_11)))),
                   10.0,"%.0f",0);
      SliderFloat("IndentSpacing",&local_18->IndentSpacing,
                  (float)(CONCAT13(extraout_XMM0_Bd_12,
                                   CONCAT12(extraout_XMM0_Bc_12,
                                            CONCAT11(extraout_XMM0_Bb_12,extraout_XMM0_Ba_12))) ^
                         CONCAT13(extraout_XMM0_Bd_12,
                                  CONCAT12(extraout_XMM0_Bc_12,
                                           CONCAT11(extraout_XMM0_Bb_12,extraout_XMM0_Ba_12)))),30.0
                  ,"%.0f",0);
      SliderFloat("ScrollbarSize",&local_18->ScrollbarSize,1.0,20.0,"%.0f",0);
      SliderFloat("GrabMinSize",&local_18->GrabMinSize,1.0,20.0,"%.0f",0);
      Text("Borders");
      SliderFloat("WindowBorderSize",&local_18->WindowBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_13,
                                   CONCAT12(extraout_XMM0_Bc_13,
                                            CONCAT11(extraout_XMM0_Bb_13,extraout_XMM0_Ba_13))) ^
                         CONCAT13(extraout_XMM0_Bd_13,
                                  CONCAT12(extraout_XMM0_Bc_13,
                                           CONCAT11(extraout_XMM0_Bb_13,extraout_XMM0_Ba_13)))),1.0,
                  "%.0f",0);
      SliderFloat("ChildBorderSize",&local_18->ChildBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_14,
                                   CONCAT12(extraout_XMM0_Bc_14,
                                            CONCAT11(extraout_XMM0_Bb_14,extraout_XMM0_Ba_14))) ^
                         CONCAT13(extraout_XMM0_Bd_14,
                                  CONCAT12(extraout_XMM0_Bc_14,
                                           CONCAT11(extraout_XMM0_Bb_14,extraout_XMM0_Ba_14)))),1.0,
                  "%.0f",0);
      SliderFloat("PopupBorderSize",&local_18->PopupBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_15,
                                   CONCAT12(extraout_XMM0_Bc_15,
                                            CONCAT11(extraout_XMM0_Bb_15,extraout_XMM0_Ba_15))) ^
                         CONCAT13(extraout_XMM0_Bd_15,
                                  CONCAT12(extraout_XMM0_Bc_15,
                                           CONCAT11(extraout_XMM0_Bb_15,extraout_XMM0_Ba_15)))),1.0,
                  "%.0f",0);
      SliderFloat("FrameBorderSize",&local_18->FrameBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_16,
                                   CONCAT12(extraout_XMM0_Bc_16,
                                            CONCAT11(extraout_XMM0_Bb_16,extraout_XMM0_Ba_16))) ^
                         CONCAT13(extraout_XMM0_Bd_16,
                                  CONCAT12(extraout_XMM0_Bc_16,
                                           CONCAT11(extraout_XMM0_Bb_16,extraout_XMM0_Ba_16)))),1.0,
                  "%.0f",0);
      SliderFloat("TabBorderSize",&local_18->TabBorderSize,
                  (float)(CONCAT13(extraout_XMM0_Bd_17,
                                   CONCAT12(extraout_XMM0_Bc_17,
                                            CONCAT11(extraout_XMM0_Bb_17,extraout_XMM0_Ba_17))) ^
                         CONCAT13(extraout_XMM0_Bd_17,
                                  CONCAT12(extraout_XMM0_Bc_17,
                                           CONCAT11(extraout_XMM0_Bb_17,extraout_XMM0_Ba_17)))),1.0,
                  "%.0f",0);
      Text("Rounding");
      SliderFloat("WindowRounding",&local_18->WindowRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_18,
                                   CONCAT12(extraout_XMM0_Bc_18,
                                            CONCAT11(extraout_XMM0_Bb_18,extraout_XMM0_Ba_18))) ^
                         CONCAT13(extraout_XMM0_Bd_18,
                                  CONCAT12(extraout_XMM0_Bc_18,
                                           CONCAT11(extraout_XMM0_Bb_18,extraout_XMM0_Ba_18)))),12.0
                  ,"%.0f",0);
      SliderFloat("ChildRounding",&local_18->ChildRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_19,
                                   CONCAT12(extraout_XMM0_Bc_19,
                                            CONCAT11(extraout_XMM0_Bb_19,extraout_XMM0_Ba_19))) ^
                         CONCAT13(extraout_XMM0_Bd_19,
                                  CONCAT12(extraout_XMM0_Bc_19,
                                           CONCAT11(extraout_XMM0_Bb_19,extraout_XMM0_Ba_19)))),12.0
                  ,"%.0f",0);
      SliderFloat("FrameRounding",&local_18->FrameRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_20,
                                   CONCAT12(extraout_XMM0_Bc_20,
                                            CONCAT11(extraout_XMM0_Bb_20,extraout_XMM0_Ba_20))) ^
                         CONCAT13(extraout_XMM0_Bd_20,
                                  CONCAT12(extraout_XMM0_Bc_20,
                                           CONCAT11(extraout_XMM0_Bb_20,extraout_XMM0_Ba_20)))),12.0
                  ,"%.0f",0);
      SliderFloat("PopupRounding",&local_18->PopupRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_21,
                                   CONCAT12(extraout_XMM0_Bc_21,
                                            CONCAT11(extraout_XMM0_Bb_21,extraout_XMM0_Ba_21))) ^
                         CONCAT13(extraout_XMM0_Bd_21,
                                  CONCAT12(extraout_XMM0_Bc_21,
                                           CONCAT11(extraout_XMM0_Bb_21,extraout_XMM0_Ba_21)))),12.0
                  ,"%.0f",0);
      SliderFloat("ScrollbarRounding",&local_18->ScrollbarRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_22,
                                   CONCAT12(extraout_XMM0_Bc_22,
                                            CONCAT11(extraout_XMM0_Bb_22,extraout_XMM0_Ba_22))) ^
                         CONCAT13(extraout_XMM0_Bd_22,
                                  CONCAT12(extraout_XMM0_Bc_22,
                                           CONCAT11(extraout_XMM0_Bb_22,extraout_XMM0_Ba_22)))),12.0
                  ,"%.0f",0);
      SliderFloat("GrabRounding",&local_18->GrabRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_23,
                                   CONCAT12(extraout_XMM0_Bc_23,
                                            CONCAT11(extraout_XMM0_Bb_23,extraout_XMM0_Ba_23))) ^
                         CONCAT13(extraout_XMM0_Bd_23,
                                  CONCAT12(extraout_XMM0_Bc_23,
                                           CONCAT11(extraout_XMM0_Bb_23,extraout_XMM0_Ba_23)))),12.0
                  ,"%.0f",0);
      SliderFloat("LogSliderDeadzone",&local_18->LogSliderDeadzone,
                  (float)(CONCAT13(extraout_XMM0_Bd_24,
                                   CONCAT12(extraout_XMM0_Bc_24,
                                            CONCAT11(extraout_XMM0_Bb_24,extraout_XMM0_Ba_24))) ^
                         CONCAT13(extraout_XMM0_Bd_24,
                                  CONCAT12(extraout_XMM0_Bc_24,
                                           CONCAT11(extraout_XMM0_Bb_24,extraout_XMM0_Ba_24)))),12.0
                  ,"%.0f",0);
      SliderFloat("TabRounding",&local_18->TabRounding,
                  (float)(CONCAT13(extraout_XMM0_Bd_25,
                                   CONCAT12(extraout_XMM0_Bc_25,
                                            CONCAT11(extraout_XMM0_Bb_25,extraout_XMM0_Ba_25))) ^
                         CONCAT13(extraout_XMM0_Bd_25,
                                  CONCAT12(extraout_XMM0_Bc_25,
                                           CONCAT11(extraout_XMM0_Bb_25,extraout_XMM0_Ba_25)))),12.0
                  ,"%.0f",0);
      Text("Alignment");
      SliderFloat2("WindowTitleAlign",&(local_18->WindowTitleAlign).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_26,
                                    CONCAT12(extraout_XMM0_Bc_26,
                                             CONCAT11(extraout_XMM0_Bb_26,extraout_XMM0_Ba_26))) ^
                          CONCAT13(extraout_XMM0_Bd_26,
                                   CONCAT12(extraout_XMM0_Bc_26,
                                            CONCAT11(extraout_XMM0_Bb_26,extraout_XMM0_Ba_26)))),1.0
                   ,"%.2f",0);
      local_3c = local_18->WindowMenuButtonPosition + 1;
      bVar16 = Combo("WindowMenuButtonPosition",&local_3c,"None",-1);
      if (bVar16) {
        local_18->WindowMenuButtonPosition = local_3c + -1;
      }
      Combo("ColorButtonPosition",&local_18->ColorButtonPosition,"Left",-1);
      SliderFloat2("ButtonTextAlign",&(local_18->ButtonTextAlign).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_27,
                                    CONCAT12(extraout_XMM0_Bc_27,
                                             CONCAT11(extraout_XMM0_Bb_27,extraout_XMM0_Ba_27))) ^
                          CONCAT13(extraout_XMM0_Bd_27,
                                   CONCAT12(extraout_XMM0_Bc_27,
                                            CONCAT11(extraout_XMM0_Bb_27,extraout_XMM0_Ba_27)))),1.0
                   ,"%.2f",0);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_28,
                                CONCAT12(extraout_XMM0_Bc_28,
                                         CONCAT11(extraout_XMM0_Bb_28,extraout_XMM0_Ba_28))) ^
                      CONCAT13(extraout_XMM0_Bd_28,
                               CONCAT12(extraout_XMM0_Bc_28,
                                        CONCAT11(extraout_XMM0_Bb_28,extraout_XMM0_Ba_28)))),-1.0);
      HelpMarker("Alignment applies when a button is larger than its text content.");
      SliderFloat2("SelectableTextAlign",&(local_18->SelectableTextAlign).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_29,
                                    CONCAT12(extraout_XMM0_Bc_29,
                                             CONCAT11(extraout_XMM0_Bb_29,extraout_XMM0_Ba_29))) ^
                          CONCAT13(extraout_XMM0_Bd_29,
                                   CONCAT12(extraout_XMM0_Bc_29,
                                            CONCAT11(extraout_XMM0_Bb_29,extraout_XMM0_Ba_29)))),1.0
                   ,"%.2f",0);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_30,
                                CONCAT12(extraout_XMM0_Bc_30,
                                         CONCAT11(extraout_XMM0_Bb_30,extraout_XMM0_Ba_30))) ^
                      CONCAT13(extraout_XMM0_Bd_30,
                               CONCAT12(extraout_XMM0_Bc_30,
                                        CONCAT11(extraout_XMM0_Bb_30,extraout_XMM0_Ba_30)))),-1.0);
      HelpMarker("Alignment applies when a selectable is larger than its text content.");
      Text("Safe Area Padding");
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_31,
                                CONCAT12(extraout_XMM0_Bc_31,
                                         CONCAT11(extraout_XMM0_Bb_31,extraout_XMM0_Ba_31))) ^
                      CONCAT13(extraout_XMM0_Bd_31,
                               CONCAT12(extraout_XMM0_Bc_31,
                                        CONCAT11(extraout_XMM0_Bb_31,extraout_XMM0_Ba_31)))),-1.0);
      HelpMarker(
                "Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured)."
                );
      SliderFloat2("DisplaySafeAreaPadding",&(local_18->DisplaySafeAreaPadding).x,
                   (float)(CONCAT13(extraout_XMM0_Bd_32,
                                    CONCAT12(extraout_XMM0_Bc_32,
                                             CONCAT11(extraout_XMM0_Bb_32,extraout_XMM0_Ba_32))) ^
                          CONCAT13(extraout_XMM0_Bd_32,
                                   CONCAT12(extraout_XMM0_Bc_32,
                                            CONCAT11(extraout_XMM0_Bb_32,extraout_XMM0_Ba_32)))),
                   30.0,"%.0f",0);
      EndTabItem();
    }
    bVar16 = BeginTabItem("Colors",(bool *)0x0,0);
    if (bVar16) {
      ImVec2::ImVec2((ImVec2 *)((long)&col + 4),0.0,0.0);
      bVar16 = Button("Export",(ImVec2 *)((long)&col + 4));
      cVar21 = extraout_XMM0_Ba_33;
      cVar23 = extraout_XMM0_Bb_33;
      cVar26 = extraout_XMM0_Bc_33;
      cVar28 = extraout_XMM0_Bd_33;
      if (bVar16) {
        if (ShowStyleEditor::output_dest == 0) {
          LogToClipboard(-1);
        }
        else {
          LogToTTY(-1);
        }
        LogText("ImVec4* colors = ImGui::GetStyle().Colors;\n");
        for (col._0_4_ = 0; (int)col < 0x35; col._0_4_ = (int)col + 1) {
          name = (char *)(local_18->Colors + (int)col);
          __s = GetStyleColorName((int)col);
          local_58 = __s;
          if ((ShowStyleEditor::output_only_modified & 1U) == 0) {
LAB_0018b751:
            sVar18 = strlen(__s);
            LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);\n",
                    CONCAT17(extraout_XMM0_Bh,
                             CONCAT16(extraout_XMM0_Bg,
                                      CONCAT15(extraout_XMM0_Bf,
                                               CONCAT14(extraout_XMM0_Be,
                                                        CONCAT13(cVar28,CONCAT12(cVar26,CONCAT11(
                                                  cVar23,cVar21))))))),(double)*(float *)(name + 4),
                    (double)*(float *)(name + 8),(double)*(float *)(name + 0xc),__s,
                    (ulong)(0x17 - (int)sVar18),"");
          }
          else {
            IVar1 = style->Colors[(int)col];
            cVar21 = -(*name == IVar1.x._0_1_);
            cVar23 = -(name[1] == IVar1.x._1_1_);
            cVar26 = -(name[2] == IVar1.x._2_1_);
            cVar28 = -(name[3] == IVar1.x._3_1_);
            cVar29 = -(name[4] == IVar1.y._0_1_);
            cVar30 = -(name[5] == IVar1.y._1_1_);
            cVar31 = -(name[6] == IVar1.y._2_1_);
            cVar32 = -(name[7] == IVar1.y._3_1_);
            cVar33 = -(name[8] == IVar1.z._0_1_);
            cVar34 = -(name[9] == IVar1.z._1_1_);
            cVar35 = -(name[10] == IVar1.z._2_1_);
            cVar36 = -(name[0xb] == IVar1.z._3_1_);
            cVar37 = -(name[0xc] == IVar1.w._0_1_);
            cVar38 = -(name[0xd] == IVar1.w._1_1_);
            cVar39 = -(name[0xe] == IVar1.w._2_1_);
            bVar40 = -(name[0xf] == IVar1.w._3_1_);
            auVar4[1] = cVar23;
            auVar4[0] = cVar21;
            auVar4[2] = cVar26;
            auVar4[3] = cVar28;
            auVar4[4] = cVar29;
            auVar4[5] = cVar30;
            auVar4[6] = cVar31;
            auVar4[7] = cVar32;
            auVar4[8] = cVar33;
            auVar4[9] = cVar34;
            auVar4[10] = cVar35;
            auVar4[0xb] = cVar36;
            auVar4[0xc] = cVar37;
            auVar4[0xd] = cVar38;
            auVar4[0xe] = cVar39;
            auVar4[0xf] = bVar40;
            auVar5[1] = cVar23;
            auVar5[0] = cVar21;
            auVar5[2] = cVar26;
            auVar5[3] = cVar28;
            auVar5[4] = cVar29;
            auVar5[5] = cVar30;
            auVar5[6] = cVar31;
            auVar5[7] = cVar32;
            auVar5[8] = cVar33;
            auVar5[9] = cVar34;
            auVar5[10] = cVar35;
            auVar5[0xb] = cVar36;
            auVar5[0xc] = cVar37;
            auVar5[0xd] = cVar38;
            auVar5[0xe] = cVar39;
            auVar5[0xf] = bVar40;
            auVar14[1] = cVar28;
            auVar14[0] = cVar26;
            auVar14[2] = cVar29;
            auVar14[3] = cVar30;
            auVar14[4] = cVar31;
            auVar14[5] = cVar32;
            auVar14[6] = cVar33;
            auVar14[7] = cVar34;
            auVar14[8] = cVar35;
            auVar14[9] = cVar36;
            auVar14[10] = cVar37;
            auVar14[0xb] = cVar38;
            auVar14[0xc] = cVar39;
            auVar14[0xd] = bVar40;
            auVar12[1] = cVar29;
            auVar12[0] = cVar28;
            auVar12[2] = cVar30;
            auVar12[3] = cVar31;
            auVar12[4] = cVar32;
            auVar12[5] = cVar33;
            auVar12[6] = cVar34;
            auVar12[7] = cVar35;
            auVar12[8] = cVar36;
            auVar12[9] = cVar37;
            auVar12[10] = cVar38;
            auVar12[0xb] = cVar39;
            auVar12[0xc] = bVar40;
            auVar10[1] = cVar30;
            auVar10[0] = cVar29;
            auVar10[2] = cVar31;
            auVar10[3] = cVar32;
            auVar10[4] = cVar33;
            auVar10[5] = cVar34;
            auVar10[6] = cVar35;
            auVar10[7] = cVar36;
            auVar10[8] = cVar37;
            auVar10[9] = cVar38;
            auVar10[10] = cVar39;
            auVar10[0xb] = bVar40;
            auVar8[1] = cVar31;
            auVar8[0] = cVar30;
            auVar8[2] = cVar32;
            auVar8[3] = cVar33;
            auVar8[4] = cVar34;
            auVar8[5] = cVar35;
            auVar8[6] = cVar36;
            auVar8[7] = cVar37;
            auVar8[8] = cVar38;
            auVar8[9] = cVar39;
            auVar8[10] = bVar40;
            if ((ushort)((ushort)(SUB161(auVar4 >> 7,0) & 1) |
                         (ushort)(SUB161(auVar5 >> 0xf,0) & 1) << 1 |
                         (ushort)(SUB141(auVar14 >> 7,0) & 1) << 2 |
                         (ushort)(SUB131(auVar12 >> 7,0) & 1) << 3 |
                         (ushort)(SUB121(auVar10 >> 7,0) & 1) << 4 |
                         (ushort)(SUB111(auVar8 >> 7,0) & 1) << 5 |
                         (ushort)((byte)(CONCAT19(bVar40,CONCAT18(cVar39,CONCAT17(cVar38,CONCAT16(
                                                  cVar37,CONCAT15(cVar36,CONCAT14(cVar35,CONCAT13(
                                                  cVar34,CONCAT12(cVar33,CONCAT11(cVar32,cVar31)))))
                                                  )))) >> 7) & 1) << 6 |
                         (ushort)((byte)(CONCAT18(bVar40,CONCAT17(cVar39,CONCAT16(cVar38,CONCAT15(
                                                  cVar37,CONCAT14(cVar36,CONCAT13(cVar35,CONCAT12(
                                                  cVar34,CONCAT11(cVar33,cVar32)))))))) >> 7) & 1)
                         << 7 | (ushort)(bVar40 >> 7) << 0xf) != 0xffff) goto LAB_0018b751;
          }
        }
        LogFinish();
        cVar21 = extraout_XMM0_Ba_34;
        cVar23 = extraout_XMM0_Bb_34;
        cVar26 = extraout_XMM0_Bc_34;
        cVar28 = extraout_XMM0_Bd_34;
      }
      SameLine((float)(CONCAT13(cVar28,CONCAT12(cVar26,CONCAT11(cVar23,cVar21))) ^
                      CONCAT13(cVar28,CONCAT12(cVar26,CONCAT11(cVar23,cVar21)))),-1.0);
      SetNextItemWidth(120.0);
      Combo("##output_type",&ShowStyleEditor::output_dest,"To Clipboard",-1);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_35,
                                CONCAT12(extraout_XMM0_Bc_35,
                                         CONCAT11(extraout_XMM0_Bb_35,extraout_XMM0_Ba_35))) ^
                      CONCAT13(extraout_XMM0_Bd_35,
                               CONCAT12(extraout_XMM0_Bc_35,
                                        CONCAT11(extraout_XMM0_Bb_35,extraout_XMM0_Ba_35)))),-1.0);
      Checkbox("Only Modified Colors",&ShowStyleEditor::output_only_modified);
      if ((ShowStyleEditor(ImGuiStyle*)::filter == '\0') &&
         (iVar17 = __cxa_guard_acquire(&ShowStyleEditor(ImGuiStyle*)::filter), iVar17 != 0)) {
        ImGuiTextFilter::ImGuiTextFilter(&ShowStyleEditor::filter,"");
        __cxa_atexit(ImGuiTextFilter::~ImGuiTextFilter,&ShowStyleEditor::filter,&__dso_handle);
        __cxa_guard_release(&ShowStyleEditor(ImGuiStyle*)::filter);
      }
      fVar6 = GetFontSize();
      ImGuiTextFilter::Draw(&ShowStyleEditor::filter,"Filter colors",fVar6 * 16.0);
      bVar16 = RadioButton("Opaque",ShowStyleEditor::alpha_flags == 0);
      if (bVar16) {
        ShowStyleEditor::alpha_flags = 0;
      }
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_36,
                                CONCAT12(extraout_XMM0_Bc_36,
                                         CONCAT11(extraout_XMM0_Bb_36,extraout_XMM0_Ba_36))) ^
                      CONCAT13(extraout_XMM0_Bd_36,
                               CONCAT12(extraout_XMM0_Bc_36,
                                        CONCAT11(extraout_XMM0_Bb_36,extraout_XMM0_Ba_36)))),-1.0);
      bVar16 = RadioButton("Alpha",ShowStyleEditor::alpha_flags == 0x20000);
      if (bVar16) {
        ShowStyleEditor::alpha_flags = 0x20000;
      }
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_37,
                                CONCAT12(extraout_XMM0_Bc_37,
                                         CONCAT11(extraout_XMM0_Bb_37,extraout_XMM0_Ba_37))) ^
                      CONCAT13(extraout_XMM0_Bd_37,
                               CONCAT12(extraout_XMM0_Bc_37,
                                        CONCAT11(extraout_XMM0_Bb_37,extraout_XMM0_Ba_37)))),-1.0);
      bVar16 = RadioButton("Both",ShowStyleEditor::alpha_flags == 0x40000);
      if (bVar16) {
        ShowStyleEditor::alpha_flags = 0x40000;
      }
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_38,
                                CONCAT12(extraout_XMM0_Bc_38,
                                         CONCAT11(extraout_XMM0_Bb_38,extraout_XMM0_Ba_38))) ^
                      CONCAT13(extraout_XMM0_Bd_38,
                               CONCAT12(extraout_XMM0_Bc_38,
                                        CONCAT11(extraout_XMM0_Bb_38,extraout_XMM0_Ba_38)))),-1.0);
      HelpMarker(
                "In the color list:\nLeft-click on color square to open color picker,\nRight-click to open edit options menu."
                );
      ImVec2::ImVec2((ImVec2 *)&stack0xffffffffffffffa0,0.0,0.0);
      BeginChild("##colors",(ImVec2 *)&stack0xffffffffffffffa0,true,0x80c000);
      PushItemWidth(-160.0);
      for (name_1._4_4_ = 0; name_1._4_4_ < 0x35; name_1._4_4_ = name_1._4_4_ + 1) {
        local_70 = GetStyleColorName(name_1._4_4_);
        bVar16 = ImGuiTextFilter::PassFilter(&ShowStyleEditor::filter,local_70,(char *)0x0);
        if (bVar16) {
          PushID(name_1._4_4_);
          ColorEdit4("##color",&local_18->Colors[name_1._4_4_].x,
                     ShowStyleEditor::alpha_flags | 0x10000);
          pIVar19 = local_18->Colors + name_1._4_4_;
          IVar1 = style->Colors[name_1._4_4_];
          cVar21 = -(*(char *)&pIVar19->x == IVar1.x._0_1_);
          cVar23 = -(*(undefined1 *)((long)&pIVar19->x + 1) == IVar1.x._1_1_);
          cVar26 = -(*(undefined1 *)((long)&pIVar19->x + 2) == IVar1.x._2_1_);
          cVar28 = -(*(undefined1 *)((long)&pIVar19->x + 3) == IVar1.x._3_1_);
          cVar29 = -(*(char *)&pIVar19->y == IVar1.y._0_1_);
          cVar30 = -(*(undefined1 *)((long)&pIVar19->y + 1) == IVar1.y._1_1_);
          cVar31 = -(*(undefined1 *)((long)&pIVar19->y + 2) == IVar1.y._2_1_);
          cVar32 = -(*(undefined1 *)((long)&pIVar19->y + 3) == IVar1.y._3_1_);
          cVar33 = -(*(char *)&pIVar19->z == IVar1.z._0_1_);
          cVar34 = -(*(undefined1 *)((long)&pIVar19->z + 1) == IVar1.z._1_1_);
          cVar35 = -(*(undefined1 *)((long)&pIVar19->z + 2) == IVar1.z._2_1_);
          cVar36 = -(*(undefined1 *)((long)&pIVar19->z + 3) == IVar1.z._3_1_);
          cVar37 = -(*(char *)&pIVar19->w == IVar1.w._0_1_);
          cVar38 = -(*(undefined1 *)((long)&pIVar19->w + 1) == IVar1.w._1_1_);
          cVar39 = -(*(undefined1 *)((long)&pIVar19->w + 2) == IVar1.w._2_1_);
          bVar40 = -(*(undefined1 *)((long)&pIVar19->w + 3) == IVar1.w._3_1_);
          auVar2[1] = cVar23;
          auVar2[0] = cVar21;
          auVar2[2] = cVar26;
          auVar2[3] = cVar28;
          auVar2[4] = cVar29;
          auVar2[5] = cVar30;
          auVar2[6] = cVar31;
          auVar2[7] = cVar32;
          auVar2[8] = cVar33;
          auVar2[9] = cVar34;
          auVar2[10] = cVar35;
          auVar2[0xb] = cVar36;
          auVar2[0xc] = cVar37;
          auVar2[0xd] = cVar38;
          auVar2[0xe] = cVar39;
          auVar2[0xf] = bVar40;
          auVar3[1] = cVar23;
          auVar3[0] = cVar21;
          auVar3[2] = cVar26;
          auVar3[3] = cVar28;
          auVar3[4] = cVar29;
          auVar3[5] = cVar30;
          auVar3[6] = cVar31;
          auVar3[7] = cVar32;
          auVar3[8] = cVar33;
          auVar3[9] = cVar34;
          auVar3[10] = cVar35;
          auVar3[0xb] = cVar36;
          auVar3[0xc] = cVar37;
          auVar3[0xd] = cVar38;
          auVar3[0xe] = cVar39;
          auVar3[0xf] = bVar40;
          auVar15[1] = cVar28;
          auVar15[0] = cVar26;
          auVar15[2] = cVar29;
          auVar15[3] = cVar30;
          auVar15[4] = cVar31;
          auVar15[5] = cVar32;
          auVar15[6] = cVar33;
          auVar15[7] = cVar34;
          auVar15[8] = cVar35;
          auVar15[9] = cVar36;
          auVar15[10] = cVar37;
          auVar15[0xb] = cVar38;
          auVar15[0xc] = cVar39;
          auVar15[0xd] = bVar40;
          auVar13[1] = cVar29;
          auVar13[0] = cVar28;
          auVar13[2] = cVar30;
          auVar13[3] = cVar31;
          auVar13[4] = cVar32;
          auVar13[5] = cVar33;
          auVar13[6] = cVar34;
          auVar13[7] = cVar35;
          auVar13[8] = cVar36;
          auVar13[9] = cVar37;
          auVar13[10] = cVar38;
          auVar13[0xb] = cVar39;
          auVar13[0xc] = bVar40;
          auVar11[1] = cVar30;
          auVar11[0] = cVar29;
          auVar11[2] = cVar31;
          auVar11[3] = cVar32;
          auVar11[4] = cVar33;
          auVar11[5] = cVar34;
          auVar11[6] = cVar35;
          auVar11[7] = cVar36;
          auVar11[8] = cVar37;
          auVar11[9] = cVar38;
          auVar11[10] = cVar39;
          auVar11[0xb] = bVar40;
          auVar9[1] = cVar31;
          auVar9[0] = cVar30;
          auVar9[2] = cVar32;
          auVar9[3] = cVar33;
          auVar9[4] = cVar34;
          auVar9[5] = cVar35;
          auVar9[6] = cVar36;
          auVar9[7] = cVar37;
          auVar9[8] = cVar38;
          auVar9[9] = cVar39;
          auVar9[10] = bVar40;
          if ((ushort)((ushort)(SUB161(auVar2 >> 7,0) & 1) |
                       (ushort)(SUB161(auVar3 >> 0xf,0) & 1) << 1 |
                       (ushort)(SUB141(auVar15 >> 7,0) & 1) << 2 |
                       (ushort)(SUB131(auVar13 >> 7,0) & 1) << 3 |
                       (ushort)(SUB121(auVar11 >> 7,0) & 1) << 4 |
                       (ushort)(SUB111(auVar9 >> 7,0) & 1) << 5 |
                       (ushort)((byte)(CONCAT19(bVar40,CONCAT18(cVar39,CONCAT17(cVar38,CONCAT16(
                                                  cVar37,CONCAT15(cVar36,CONCAT14(cVar35,CONCAT13(
                                                  cVar34,CONCAT12(cVar33,CONCAT11(cVar32,cVar31)))))
                                                  )))) >> 7) & 1) << 6 |
                       (ushort)((byte)(CONCAT18(bVar40,CONCAT17(cVar39,CONCAT16(cVar38,CONCAT15(
                                                  cVar37,CONCAT14(cVar36,CONCAT13(cVar35,CONCAT12(
                                                  cVar34,CONCAT11(cVar33,cVar32)))))))) >> 7) & 1)
                       << 7 | (ushort)(bVar40 >> 7) << 0xf) != 0xffff) {
            SameLine((float)(CONCAT13(cVar28,CONCAT12(cVar26,CONCAT11(cVar23,cVar21))) ^
                            CONCAT13(cVar28,CONCAT12(cVar26,CONCAT11(cVar23,cVar21)))),
                     (local_18->ItemInnerSpacing).x);
            ImVec2::ImVec2(&local_78,0.0,0.0);
            bVar16 = Button("Save",&local_78);
            if (bVar16) {
              pIVar20 = local_18->Colors + name_1._4_4_;
              pIVar19 = style->Colors + name_1._4_4_;
              fVar6 = pIVar20->y;
              pIVar19->x = pIVar20->x;
              pIVar19->y = fVar6;
              fVar6 = pIVar20->w;
              pIVar19->z = pIVar20->z;
              pIVar19->w = fVar6;
            }
            SameLine((float)(CONCAT13(extraout_XMM0_Bd_39,
                                      CONCAT12(extraout_XMM0_Bc_39,
                                               CONCAT11(extraout_XMM0_Bb_39,extraout_XMM0_Ba_39))) ^
                            CONCAT13(extraout_XMM0_Bd_39,
                                     CONCAT12(extraout_XMM0_Bc_39,
                                              CONCAT11(extraout_XMM0_Bb_39,extraout_XMM0_Ba_39)))),
                     (local_18->ItemInnerSpacing).x);
            ImVec2::ImVec2((ImVec2 *)&io,0.0,0.0);
            bVar16 = Button("Revert",(ImVec2 *)&io);
            cVar21 = extraout_XMM0_Ba_40;
            cVar23 = extraout_XMM0_Bb_40;
            cVar26 = extraout_XMM0_Bc_40;
            cVar28 = extraout_XMM0_Bd_40;
            if (bVar16) {
              pIVar20 = style->Colors + name_1._4_4_;
              pIVar19 = local_18->Colors + name_1._4_4_;
              fVar6 = pIVar20->y;
              pIVar19->x = pIVar20->x;
              pIVar19->y = fVar6;
              fVar6 = pIVar20->w;
              pIVar19->z = pIVar20->z;
              pIVar19->w = fVar6;
            }
          }
          SameLine((float)(CONCAT13(cVar28,CONCAT12(cVar26,CONCAT11(cVar23,cVar21))) ^
                          CONCAT13(cVar28,CONCAT12(cVar26,CONCAT11(cVar23,cVar21)))),
                   (local_18->ItemInnerSpacing).x);
          TextUnformatted(local_70,(char *)0x0);
          PopID();
        }
      }
      PopItemWidth();
      EndChild();
      EndTabItem();
    }
    bVar16 = BeginTabItem("Fonts",(bool *)0x0,0);
    if (bVar16) {
      atlas = (ImFontAtlas *)GetIO();
      _MAX_SCALE = ((ImGuiIO *)atlas)->Fonts;
      HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
      ShowFontAtlas(_MAX_SCALE);
      local_94 = 0x3e99999a;
      local_98 = 0x40000000;
      HelpMarker(
                "Those are old settings provided for convenience.\nHowever, the _correct_ way of scaling your UI is currently to reload your font at the designed size, rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\nUsing those settings here will give you poor quality results."
                );
      fVar6 = GetFontSize();
      PushItemWidth(fVar6 * 8.0);
      bVar16 = DragFloat("window scale",&ShowStyleEditor::window_scale,0.005,0.3,2.0,"%.2f",0x10);
      if (bVar16) {
        SetWindowFontScale(ShowStyleEditor::window_scale);
      }
      DragFloat("global scale",(float *)&(atlas->Fonts).Data,0.005,0.3,2.0,"%.2f",0x10);
      PopItemWidth();
      EndTabItem();
    }
    bVar16 = BeginTabItem("Rendering",(bool *)0x0,0);
    if (bVar16) {
      Checkbox("Anti-aliased lines",&local_18->AntiAliasedLines);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_41,
                                CONCAT12(extraout_XMM0_Bc_41,
                                         CONCAT11(extraout_XMM0_Bb_41,extraout_XMM0_Ba_41))) ^
                      CONCAT13(extraout_XMM0_Bd_41,
                               CONCAT12(extraout_XMM0_Bc_41,
                                        CONCAT11(extraout_XMM0_Bb_41,extraout_XMM0_Ba_41)))),-1.0);
      HelpMarker(
                "When disabling anti-aliasing lines, you\'ll probably want to disable borders in your style as well."
                );
      Checkbox("Anti-aliased lines use texture",&local_18->AntiAliasedLinesUseTex);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_42,
                                CONCAT12(extraout_XMM0_Bc_42,
                                         CONCAT11(extraout_XMM0_Bb_42,extraout_XMM0_Ba_42))) ^
                      CONCAT13(extraout_XMM0_Bd_42,
                               CONCAT12(extraout_XMM0_Bc_42,
                                        CONCAT11(extraout_XMM0_Bb_42,extraout_XMM0_Ba_42)))),-1.0);
      HelpMarker(
                "Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering)."
                );
      Checkbox("Anti-aliased fill",&local_18->AntiAliasedFill);
      fVar6 = GetFontSize();
      PushItemWidth(fVar6 * 8.0);
      DragFloat("Curve Tessellation Tolerance",&local_18->CurveTessellationTol,0.02,0.1,10.0,"%.2f",
                0);
      if (local_18->CurveTessellationTol <= 0.1 && local_18->CurveTessellationTol != 0.1) {
        local_18->CurveTessellationTol = 0.1;
      }
      DragFloat("Circle Tessellation Max Error",&local_18->CircleTessellationMaxError,0.005,0.1,5.0,
                "%.2f",0x10);
      bVar16 = IsItemActive();
      uVar22 = extraout_XMM0_Ba_43;
      uVar24 = extraout_XMM0_Bb_43;
      uVar25 = extraout_XMM0_Bc_43;
      uVar27 = extraout_XMM0_Bd_43;
      if (bVar16) {
        local_a0 = GetCursorScreenPos();
        ImVec2::ImVec2((ImVec2 *)&draw_list,0.0,0.0);
        SetNextWindowPos(&local_a0,0,(ImVec2 *)&draw_list);
        BeginTooltip();
        TextUnformatted("(R = radius, N = number of segments)",(char *)0x0);
        Spacing();
        this = GetWindowDrawList();
        IVar7 = CalcTextSize("N: MMM\nR: MMM",(char *)0x0,false,-1.0);
        RAD_MIN = IVar7.x;
        for (RAD_MAX = 0.0; (int)RAD_MAX < 8; RAD_MAX = (float)((int)RAD_MAX + 1)) {
          fVar6 = ((float)(int)RAD_MAX * 65.0) / 7.0 + 5.0;
          BeginGroup();
          iVar17 = ImDrawList::_CalcCircleAutoSegmentCount(this,fVar6);
          Text("R: %.f\nN: %d",iVar17);
          if (RAD_MIN < fVar6 * 2.0) {
            local_134 = fVar6 * 2.0;
          }
          else {
            local_134 = RAD_MIN;
          }
          p1.y = floorf(local_134 * 0.5);
          p1.x = 70.0;
          local_e0 = GetCursorScreenPos();
          ImVec2::ImVec2(&local_e8,local_e0.x + p1.y,local_e0.y + p1.x);
          col_00 = GetColorU32(0,1.0);
          ImDrawList::AddCircle(this,&local_e8,fVar6,col_00,0,1.0);
          ImVec2::ImVec2(&local_f0,local_134,140.0);
          Dummy(&local_f0);
          EndGroup();
          SameLine((float)(CONCAT13(extraout_XMM0_Bd_44,
                                    CONCAT12(extraout_XMM0_Bc_44,
                                             CONCAT11(extraout_XMM0_Bb_44,extraout_XMM0_Ba_44))) ^
                          CONCAT13(extraout_XMM0_Bd_44,
                                   CONCAT12(extraout_XMM0_Bc_44,
                                            CONCAT11(extraout_XMM0_Bb_44,extraout_XMM0_Ba_44)))),
                   -1.0);
        }
        EndTooltip();
        uVar22 = extraout_XMM0_Ba_45;
        uVar24 = extraout_XMM0_Bb_45;
        uVar25 = extraout_XMM0_Bc_45;
        uVar27 = extraout_XMM0_Bd_45;
      }
      SameLine((float)(CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22))) ^
                      CONCAT13(uVar27,CONCAT12(uVar25,CONCAT11(uVar24,uVar22)))),-1.0);
      HelpMarker(
                "When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically."
                );
      DragFloat("Global Alpha",&local_18->Alpha,0.005,0.2,1.0,"%.2f",0);
      DragFloat("Disabled Alpha",&local_18->DisabledAlpha,0.005,0.0,1.0,"%.2f",0);
      SameLine((float)(CONCAT13(extraout_XMM0_Bd_46,
                                CONCAT12(extraout_XMM0_Bc_46,
                                         CONCAT11(extraout_XMM0_Bb_46,extraout_XMM0_Ba_46))) ^
                      CONCAT13(extraout_XMM0_Bd_46,
                               CONCAT12(extraout_XMM0_Bc_46,
                                        CONCAT11(extraout_XMM0_Bb_46,extraout_XMM0_Ba_46)))),-1.0);
      HelpMarker(
                "Additional alpha multiplier for disabled items (multiply over current value of Alpha)."
                );
      PopItemWidth();
      EndTabItem();
    }
    EndTabBar();
  }
  PopItemWidth();
  return;
}

Assistant:

void ImGui::ShowStyleEditor(ImGuiStyle* ref)
{
    IMGUI_DEMO_MARKER("Tools/Style Editor");
    // You can pass in a reference ImGuiStyle structure to compare to, revert to and save to
    // (without a reference style pointer, we will use one compared locally as a reference)
    ImGuiStyle& style = ImGui::GetStyle();
    static ImGuiStyle ref_saved_style;

    // Default to using internal storage as reference
    static bool init = true;
    if (init && ref == NULL)
        ref_saved_style = style;
    init = false;
    if (ref == NULL)
        ref = &ref_saved_style;

    ImGui::PushItemWidth(ImGui::GetWindowWidth() * 0.50f);

    if (ImGui::ShowStyleSelector("Colors##Selector"))
        ref_saved_style = style;
    ImGui::ShowFontSelector("Fonts##Selector");

    // Simplified Settings (expose floating-pointer border sizes as boolean representing 0.0f or 1.0f)
    if (ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f"))
        style.GrabRounding = style.FrameRounding; // Make GrabRounding always the same value as FrameRounding
    { bool border = (style.WindowBorderSize > 0.0f); if (ImGui::Checkbox("WindowBorder", &border)) { style.WindowBorderSize = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.FrameBorderSize > 0.0f);  if (ImGui::Checkbox("FrameBorder",  &border)) { style.FrameBorderSize  = border ? 1.0f : 0.0f; } }
    ImGui::SameLine();
    { bool border = (style.PopupBorderSize > 0.0f);  if (ImGui::Checkbox("PopupBorder",  &border)) { style.PopupBorderSize  = border ? 1.0f : 0.0f; } }

    // Save/Revert button
    if (ImGui::Button("Save Ref"))
        *ref = ref_saved_style = style;
    ImGui::SameLine();
    if (ImGui::Button("Revert Ref"))
        style = *ref;
    ImGui::SameLine();
    HelpMarker(
        "Save/Revert in local non-persistent storage. Default Colors definition are not affected. "
        "Use \"Export\" below to save them somewhere.");

    ImGui::Separator();

    if (ImGui::BeginTabBar("##tabs", ImGuiTabBarFlags_None))
    {
        if (ImGui::BeginTabItem("Sizes"))
        {
            ImGui::Text("Main");
            ImGui::SliderFloat2("WindowPadding", (float*)&style.WindowPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("FramePadding", (float*)&style.FramePadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("CellPadding", (float*)&style.CellPadding, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemSpacing", (float*)&style.ItemSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("ItemInnerSpacing", (float*)&style.ItemInnerSpacing, 0.0f, 20.0f, "%.0f");
            ImGui::SliderFloat2("TouchExtraPadding", (float*)&style.TouchExtraPadding, 0.0f, 10.0f, "%.0f");
            ImGui::SliderFloat("IndentSpacing", &style.IndentSpacing, 0.0f, 30.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarSize", &style.ScrollbarSize, 1.0f, 20.0f, "%.0f");
            ImGui::SliderFloat("GrabMinSize", &style.GrabMinSize, 1.0f, 20.0f, "%.0f");
            ImGui::Text("Borders");
            ImGui::SliderFloat("WindowBorderSize", &style.WindowBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("ChildBorderSize", &style.ChildBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("PopupBorderSize", &style.PopupBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("FrameBorderSize", &style.FrameBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::SliderFloat("TabBorderSize", &style.TabBorderSize, 0.0f, 1.0f, "%.0f");
            ImGui::Text("Rounding");
            ImGui::SliderFloat("WindowRounding", &style.WindowRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ChildRounding", &style.ChildRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("FrameRounding", &style.FrameRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("PopupRounding", &style.PopupRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("ScrollbarRounding", &style.ScrollbarRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("GrabRounding", &style.GrabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("LogSliderDeadzone", &style.LogSliderDeadzone, 0.0f, 12.0f, "%.0f");
            ImGui::SliderFloat("TabRounding", &style.TabRounding, 0.0f, 12.0f, "%.0f");
            ImGui::Text("Alignment");
            ImGui::SliderFloat2("WindowTitleAlign", (float*)&style.WindowTitleAlign, 0.0f, 1.0f, "%.2f");
            int window_menu_button_position = style.WindowMenuButtonPosition + 1;
            if (ImGui::Combo("WindowMenuButtonPosition", (int*)&window_menu_button_position, "None\0Left\0Right\0"))
                style.WindowMenuButtonPosition = window_menu_button_position - 1;
            ImGui::Combo("ColorButtonPosition", (int*)&style.ColorButtonPosition, "Left\0Right\0");
            ImGui::SliderFloat2("ButtonTextAlign", (float*)&style.ButtonTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a button is larger than its text content.");
            ImGui::SliderFloat2("SelectableTextAlign", (float*)&style.SelectableTextAlign, 0.0f, 1.0f, "%.2f");
            ImGui::SameLine(); HelpMarker("Alignment applies when a selectable is larger than its text content.");
            ImGui::Text("Safe Area Padding");
            ImGui::SameLine(); HelpMarker("Adjust if you cannot see the edges of your screen (e.g. on a TV where scaling has not been configured).");
            ImGui::SliderFloat2("DisplaySafeAreaPadding", (float*)&style.DisplaySafeAreaPadding, 0.0f, 30.0f, "%.0f");
            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Colors"))
        {
            static int output_dest = 0;
            static bool output_only_modified = true;
            if (ImGui::Button("Export"))
            {
                if (output_dest == 0)
                    ImGui::LogToClipboard();
                else
                    ImGui::LogToTTY();
                ImGui::LogText("ImVec4* colors = ImGui::GetStyle().Colors;" IM_NEWLINE);
                for (int i = 0; i < ImGuiCol_COUNT; i++)
                {
                    const ImVec4& col = style.Colors[i];
                    const char* name = ImGui::GetStyleColorName(i);
                    if (!output_only_modified || memcmp(&col, &ref->Colors[i], sizeof(ImVec4)) != 0)
                        ImGui::LogText("colors[ImGuiCol_%s]%*s= ImVec4(%.2ff, %.2ff, %.2ff, %.2ff);" IM_NEWLINE,
                            name, 23 - (int)strlen(name), "", col.x, col.y, col.z, col.w);
                }
                ImGui::LogFinish();
            }
            ImGui::SameLine(); ImGui::SetNextItemWidth(120); ImGui::Combo("##output_type", &output_dest, "To Clipboard\0To TTY\0");
            ImGui::SameLine(); ImGui::Checkbox("Only Modified Colors", &output_only_modified);

            static ImGuiTextFilter filter;
            filter.Draw("Filter colors", ImGui::GetFontSize() * 16);

            static ImGuiColorEditFlags alpha_flags = 0;
            if (ImGui::RadioButton("Opaque", alpha_flags == ImGuiColorEditFlags_None))             { alpha_flags = ImGuiColorEditFlags_None; } ImGui::SameLine();
            if (ImGui::RadioButton("Alpha",  alpha_flags == ImGuiColorEditFlags_AlphaPreview))     { alpha_flags = ImGuiColorEditFlags_AlphaPreview; } ImGui::SameLine();
            if (ImGui::RadioButton("Both",   alpha_flags == ImGuiColorEditFlags_AlphaPreviewHalf)) { alpha_flags = ImGuiColorEditFlags_AlphaPreviewHalf; } ImGui::SameLine();
            HelpMarker(
                "In the color list:\n"
                "Left-click on color square to open color picker,\n"
                "Right-click to open edit options menu.");

            ImGui::BeginChild("##colors", ImVec2(0, 0), true, ImGuiWindowFlags_AlwaysVerticalScrollbar | ImGuiWindowFlags_AlwaysHorizontalScrollbar | ImGuiWindowFlags_NavFlattened);
            ImGui::PushItemWidth(-160);
            for (int i = 0; i < ImGuiCol_COUNT; i++)
            {
                const char* name = ImGui::GetStyleColorName(i);
                if (!filter.PassFilter(name))
                    continue;
                ImGui::PushID(i);
                ImGui::ColorEdit4("##color", (float*)&style.Colors[i], ImGuiColorEditFlags_AlphaBar | alpha_flags);
                if (memcmp(&style.Colors[i], &ref->Colors[i], sizeof(ImVec4)) != 0)
                {
                    // Tips: in a real user application, you may want to merge and use an icon font into the main font,
                    // so instead of "Save"/"Revert" you'd use icons!
                    // Read the FAQ and docs/FONTS.md about using icon fonts. It's really easy and super convenient!
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Save")) { ref->Colors[i] = style.Colors[i]; }
                    ImGui::SameLine(0.0f, style.ItemInnerSpacing.x); if (ImGui::Button("Revert")) { style.Colors[i] = ref->Colors[i]; }
                }
                ImGui::SameLine(0.0f, style.ItemInnerSpacing.x);
                ImGui::TextUnformatted(name);
                ImGui::PopID();
            }
            ImGui::PopItemWidth();
            ImGui::EndChild();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Fonts"))
        {
            ImGuiIO& io = ImGui::GetIO();
            ImFontAtlas* atlas = io.Fonts;
            HelpMarker("Read FAQ and docs/FONTS.md for details on font loading.");
            ImGui::ShowFontAtlas(atlas);

            // Post-baking font scaling. Note that this is NOT the nice way of scaling fonts, read below.
            // (we enforce hard clamping manually as by default DragFloat/SliderFloat allows CTRL+Click text to get out of bounds).
            const float MIN_SCALE = 0.3f;
            const float MAX_SCALE = 2.0f;
            HelpMarker(
                "Those are old settings provided for convenience.\n"
                "However, the _correct_ way of scaling your UI is currently to reload your font at the designed size, "
                "rebuild the font atlas, and call style.ScaleAllSizes() on a reference ImGuiStyle structure.\n"
                "Using those settings here will give you poor quality results.");
            static float window_scale = 1.0f;
            ImGui::PushItemWidth(ImGui::GetFontSize() * 8);
            if (ImGui::DragFloat("window scale", &window_scale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp)) // Scale only this window
                ImGui::SetWindowFontScale(window_scale);
            ImGui::DragFloat("global scale", &io.FontGlobalScale, 0.005f, MIN_SCALE, MAX_SCALE, "%.2f", ImGuiSliderFlags_AlwaysClamp); // Scale everything
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        if (ImGui::BeginTabItem("Rendering"))
        {
            ImGui::Checkbox("Anti-aliased lines", &style.AntiAliasedLines);
            ImGui::SameLine();
            HelpMarker("When disabling anti-aliasing lines, you'll probably want to disable borders in your style as well.");

            ImGui::Checkbox("Anti-aliased lines use texture", &style.AntiAliasedLinesUseTex);
            ImGui::SameLine();
            HelpMarker("Faster lines using texture data. Require backend to render with bilinear filtering (not point/nearest filtering).");

            ImGui::Checkbox("Anti-aliased fill", &style.AntiAliasedFill);
            ImGui::PushItemWidth(ImGui::GetFontSize() * 8);
            ImGui::DragFloat("Curve Tessellation Tolerance", &style.CurveTessellationTol, 0.02f, 0.10f, 10.0f, "%.2f");
            if (style.CurveTessellationTol < 0.10f) style.CurveTessellationTol = 0.10f;

            // When editing the "Circle Segment Max Error" value, draw a preview of its effect on auto-tessellated circles.
            ImGui::DragFloat("Circle Tessellation Max Error", &style.CircleTessellationMaxError , 0.005f, 0.10f, 5.0f, "%.2f", ImGuiSliderFlags_AlwaysClamp);
            if (ImGui::IsItemActive())
            {
                ImGui::SetNextWindowPos(ImGui::GetCursorScreenPos());
                ImGui::BeginTooltip();
                ImGui::TextUnformatted("(R = radius, N = number of segments)");
                ImGui::Spacing();
                ImDrawList* draw_list = ImGui::GetWindowDrawList();
                const float min_widget_width = ImGui::CalcTextSize("N: MMM\nR: MMM").x;
                for (int n = 0; n < 8; n++)
                {
                    const float RAD_MIN = 5.0f;
                    const float RAD_MAX = 70.0f;
                    const float rad = RAD_MIN + (RAD_MAX - RAD_MIN) * (float)n / (8.0f - 1.0f);

                    ImGui::BeginGroup();

                    ImGui::Text("R: %.f\nN: %d", rad, draw_list->_CalcCircleAutoSegmentCount(rad));

                    const float canvas_width = IM_MAX(min_widget_width, rad * 2.0f);
                    const float offset_x     = floorf(canvas_width * 0.5f);
                    const float offset_y     = floorf(RAD_MAX);

                    const ImVec2 p1 = ImGui::GetCursorScreenPos();
                    draw_list->AddCircle(ImVec2(p1.x + offset_x, p1.y + offset_y), rad, ImGui::GetColorU32(ImGuiCol_Text));
                    ImGui::Dummy(ImVec2(canvas_width, RAD_MAX * 2));

                    /*
                    const ImVec2 p2 = ImGui::GetCursorScreenPos();
                    draw_list->AddCircleFilled(ImVec2(p2.x + offset_x, p2.y + offset_y), rad, ImGui::GetColorU32(ImGuiCol_Text));
                    ImGui::Dummy(ImVec2(canvas_width, RAD_MAX * 2));
                    */

                    ImGui::EndGroup();
                    ImGui::SameLine();
                }
                ImGui::EndTooltip();
            }
            ImGui::SameLine();
            HelpMarker("When drawing circle primitives with \"num_segments == 0\" tesselation will be calculated automatically.");

            ImGui::DragFloat("Global Alpha", &style.Alpha, 0.005f, 0.20f, 1.0f, "%.2f"); // Not exposing zero here so user doesn't "lose" the UI (zero alpha clips all widgets). But application code could have a toggle to switch between zero and non-zero.
            ImGui::DragFloat("Disabled Alpha", &style.DisabledAlpha, 0.005f, 0.0f, 1.0f, "%.2f"); ImGui::SameLine(); HelpMarker("Additional alpha multiplier for disabled items (multiply over current value of Alpha).");
            ImGui::PopItemWidth();

            ImGui::EndTabItem();
        }

        ImGui::EndTabBar();
    }

    ImGui::PopItemWidth();
}